

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void probe_serial8250_comports
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *comList,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *comList8250)

{
  size_t *psVar1;
  int __fd;
  int iVar2;
  _Node *p_Var3;
  _List_node_base *p_Var4;
  int local_78 [2];
  serial_struct serinfo;
  
  p_Var4 = (comList8250->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)comList8250) {
    do {
      __fd = open((char *)p_Var4[1]._M_next,0x902);
      if (-1 < __fd) {
        iVar2 = ioctl(__fd,0x541e,local_78);
        if ((iVar2 == 0) && (local_78[0] != 0)) {
          p_Var3 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   _M_create_node<std::__cxx11::string_const&>
                             ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              comList,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var4 + 1));
          std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
          psVar1 = &(comList->
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        close(__fd);
      }
      p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)comList8250);
  }
  return;
}

Assistant:

void probe_serial8250_comports(list<string>& comList, list<string> comList8250) {
    struct serial_struct serinfo;
    list<string>::iterator it = comList8250.begin();

    // Iterate over all serial8250-devices
    while (it != comList8250.end()) {

        // Try to open the device
        int fd = open((*it).c_str(), O_RDWR | O_NONBLOCK | O_NOCTTY);

        if (fd >= 0) {
            // Get serial_info
            if (ioctl(fd, TIOCGSERIAL, &serinfo)==0) {
                // If device type is no PORT_UNKNOWN we accept the port
                if (serinfo.type != PORT_UNKNOWN)
                    comList.push_back(*it);
            }
            close(fd);
        }
        it ++;
    }
}